

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O1

EssentialVectorType * __thiscall
Eigen::
HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
::essentialVector(EssentialVectorType *__return_storage_ptr__,
                 HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                 *this,Index k)

{
  Nested pMVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  
  if ((k < 0) || (this->m_length <= k)) {
    __assert_fail("k >= 0 && k < m_length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Householder/HouseholderSequence.h"
                  ,0xc6,
                  "const EssentialVectorType Eigen::HouseholderSequence<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::essentialVector(Index) const [VectorsType = Eigen::Matrix<double, -1, -1>, CoeffsType = Eigen::Matrix<double, -1, 1>, Side = 1]"
                 );
  }
  pMVar1 = this->m_vectors;
  uVar3 = this->m_shift + k + 1;
  lVar2 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows;
  pdVar5 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data + lVar2 * k + k + this->m_shift + 1;
  uVar4 = lVar2 - uVar3;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>).
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>.
  m_data = pdVar5;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>).
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>.
  m_rows.m_value = uVar4;
  if ((long)uVar4 < 0 && pdVar5 != (double *)0x0) {
    __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/MapBase.h"
                  ,0x94,
                  "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1>, Level = 0]"
                 );
  }
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>).
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.m_xpr =
       pMVar1;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>).
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
  m_outerStride = lVar2;
  if ((-1 < (long)(uVar4 | uVar3)) &&
     (k < (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols)) {
    return __return_storage_ptr__;
  }
  __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                ,0x8d,
                "Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

const EssentialVectorType essentialVector(Index k) const
    {
      eigen_assert(k >= 0 && k < m_length);
      return internal::hseq_side_dependent_impl<VectorsType,CoeffsType,Side>::essentialVector(*this, k);
    }